

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

QTextFrame * __thiscall
QTextDocumentPrivate::insertFrame
          (QTextDocumentPrivate *this,int start,int end,QTextFrameFormat *format)

{
  long lVar1;
  int iVar2;
  QTextFormat *pQVar3;
  QTextFramePrivate *pQVar4;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int charIdx;
  int idx;
  QTextFrame *frame;
  QTextCharFormat cfmt;
  QTextDocumentPrivate *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  QTextDocumentPrivate *this_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QTextFormat *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QTextDocumentPrivate *this_01;
  QTextFrame *in_stack_ffffffffffffffa8;
  QTextFrame *pQVar5;
  QTextDocumentPrivate *in_stack_ffffffffffffffb0;
  uint local_40;
  QChar in_stack_ffffffffffffffce;
  undefined4 local_30;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  if (in_ESI != in_EDX) {
    in_stack_ffffffffffffff70 =
         (QTextFormat *)
         frameAt((QTextDocumentPrivate *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar2);
    pQVar3 = (QTextFormat *)
             frameAt((QTextDocumentPrivate *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar2);
    if (in_stack_ffffffffffffff70 != pQVar3) {
      pQVar5 = (QTextFrame *)0x0;
      goto LAB_007d719f;
    }
  }
  beginEditBlock(in_RDI);
  createObject((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(QTextFormat *)in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  pQVar5 = qobject_cast<QTextFrame*>((QObject *)0x7d6ff4);
  this_00 = (QTextDocumentPrivate *)&in_RDI->formats;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0x7d7019);
  iVar2 = QTextFormatCollection::indexForFormat
                    ((QTextFormatCollection *)in_RDI,in_stack_ffffffffffffff70);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7d703c);
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x7d706f);
  QTextObject::objectIndex((QTextObject *)in_stack_ffffffffffffff50);
  QTextFormat::setObjectIndex
            ((QTextFormat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),iVar2);
  QTextFormatCollection::indexForFormat((QTextFormatCollection *)in_RDI,in_stack_ffffffffffffff70);
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffb6,L'﷐');
  insertBlock(this_01,in_stack_ffffffffffffffce,in_ESI,in_EDX,(int)((ulong)in_RCX >> 0x20),
              (Operation)in_RCX);
  QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffb4,L'﷑');
  insertBlock(this_01,in_stack_ffffffffffffffce,in_ESI,in_EDX + 1,(int)((ulong)in_RCX >> 0x20),
              (Operation)in_RCX);
  find(this_00,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  pQVar4 = QTextFrame::d_func((QTextFrame *)0x7d7136);
  *(undefined4 *)&(pQVar4->super_QTextObjectPrivate).field_0x84 = local_30;
  find(this_00,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  pQVar4 = QTextFrame::d_func((QTextFrame *)0x7d7165);
  pQVar4->fragment_end = local_40;
  insert_frame(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  endEditBlock(in_stack_ffffffffffffff50);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d719f);
LAB_007d719f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QTextFrame *QTextDocumentPrivate::insertFrame(int start, int end, const QTextFrameFormat &format)
{
    Q_ASSERT(start >= 0 && start < length());
    Q_ASSERT(end >= 0 && end < length());
    Q_ASSERT(start <= end || end == -1);

    if (start != end && frameAt(start) != frameAt(end))
        return nullptr;

    beginEditBlock();

    QTextFrame *frame = qobject_cast<QTextFrame *>(createObject(format));
    Q_ASSERT(frame);

    // #### using the default block and char format below might be wrong
    int idx = formats.indexForFormat(QTextBlockFormat());
    QTextCharFormat cfmt;
    cfmt.setObjectIndex(frame->objectIndex());
    int charIdx = formats.indexForFormat(cfmt);

    insertBlock(QTextBeginningOfFrame, start, idx, charIdx, QTextUndoCommand::MoveCursor);
    insertBlock(QTextEndOfFrame, ++end, idx, charIdx, QTextUndoCommand::KeepCursor);

    frame->d_func()->fragment_start = find(start).n;
    frame->d_func()->fragment_end = find(end).n;

    insert_frame(frame);

    endEditBlock();

    return frame;
}